

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBase.hpp
# Opt level: O0

void __thiscall
Diligent::BufferBase<Diligent::EngineVkImplTraits>::CreateView
          (BufferBase<Diligent::EngineVkImplTraits> *this,BufferViewDesc *ViewDesc,
          IBufferView **ppView)

{
  BIND_FLAGS BVar1;
  Char *pCVar2;
  char (*in_R8) [55];
  undefined1 local_b0 [8];
  string msg_3;
  string msg_2;
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  IBufferView **ppView_local;
  BufferViewDesc *ViewDesc_local;
  BufferBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._8_8_ = ppView;
  if (ViewDesc->ViewType == BUFFER_VIEW_UNDEFINED) {
    FormatString<char[34]>((string *)local_40,(char (*) [34])"Buffer view type is not specified");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"CreateView",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BufferBase.hpp"
               ,0x7d);
    std::__cxx11::string::~string((string *)local_40);
  }
  if (ViewDesc->ViewType == BUFFER_VIEW_SHADER_RESOURCE) {
    BVar1 = Diligent::operator&((this->
                                super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                                ).m_Desc.BindFlags,BIND_SHADER_RESOURCE);
    if (BVar1 == BIND_NONE) {
      FormatString<char[38],char_const*,char[54]>
                ((string *)((long)&msg_2.field_2 + 8),
                 (Diligent *)"Attempting to create SRV for buffer \'",
                 (char (*) [38])
                 &(this->
                  super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                  ).m_Desc,(char **)"\' that was not created with BIND_SHADER_RESOURCE flag",
                 (char (*) [54])in_R8);
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"CreateView",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BufferBase.hpp"
                 ,0x7f);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    }
  }
  else if (ViewDesc->ViewType == BUFFER_VIEW_UNORDERED_ACCESS) {
    BVar1 = Diligent::operator&((this->
                                super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                                ).m_Desc.BindFlags,BIND_UNORDERED_ACCESS);
    if (BVar1 == BIND_NONE) {
      FormatString<char[38],char_const*,char[55]>
                ((string *)((long)&msg_3.field_2 + 8),
                 (Diligent *)"Attempting to create UAV for buffer \'",
                 (char (*) [38])
                 &(this->
                  super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                  ).m_Desc,(char **)"\' that was not created with BIND_UNORDERED_ACCESS flag",in_R8)
      ;
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"CreateView",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BufferBase.hpp"
                 ,0x81);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    }
  }
  else {
    FormatString<char[28]>((string *)local_b0,(char (*) [28])"Unexpected buffer view type");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"CreateView",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BufferBase.hpp"
               ,0x83);
    std::__cxx11::string::~string((string *)local_b0);
  }
  (**(code **)((long)(this->
                     super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                     ).super_ObjectBase<Diligent::IBufferVk>.
                     super_RefCountedObject<Diligent::IBufferVk>.super_IBufferVk.super_IBuffer.
                     super_IDeviceObject.super_IObject + 0xb8))(this,ViewDesc,msg.field_2._8_8_,0);
  return;
}

Assistant:

CreateView(const struct BufferViewDesc& ViewDesc, IBufferView** ppView) override
    {
        DEV_CHECK_ERR(ViewDesc.ViewType != BUFFER_VIEW_UNDEFINED, "Buffer view type is not specified");
        if (ViewDesc.ViewType == BUFFER_VIEW_SHADER_RESOURCE)
            DEV_CHECK_ERR(this->m_Desc.BindFlags & BIND_SHADER_RESOURCE, "Attempting to create SRV for buffer '", this->m_Desc.Name, "' that was not created with BIND_SHADER_RESOURCE flag");
        else if (ViewDesc.ViewType == BUFFER_VIEW_UNORDERED_ACCESS)
            DEV_CHECK_ERR(this->m_Desc.BindFlags & BIND_UNORDERED_ACCESS, "Attempting to create UAV for buffer '", this->m_Desc.Name, "' that was not created with BIND_UNORDERED_ACCESS flag");
        else
            UNEXPECTED("Unexpected buffer view type");

        CreateViewInternal(ViewDesc, ppView, false);
    }